

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::TestErrorHandler::handleApplicationError
          (TestErrorHandler *this,Exception *exception,Maybe<kj::HttpService::Response_&> *response)

{
  StringPtr *in_RCX;
  StringPtr *params_1;
  StringPtr statusText;
  Maybe<kj::HttpService::Response_&> local_68;
  ArrayPtr<const_char> local_60;
  String local_50;
  StringPtr local_38;
  Maybe<kj::HttpService::Response_&> *response_local;
  Exception *exception_local;
  TestErrorHandler *this_local;
  
  params_1 = in_RCX;
  response_local = response;
  exception_local = exception;
  this_local = this;
  StringPtr::StringPtr(&local_38,"Internal Server Error");
  local_60 = (ArrayPtr<const_char>)Exception::getDescription((Exception *)response);
  str<char_const(&)[24],kj::StringPtr>
            (&local_50,(kj *)"Saw application error: ",(char (*) [24])&local_60,params_1);
  Maybe<kj::HttpService::Response_&>::Maybe
            (&local_68,(PropagateConst<kj::HttpService::Response,_Maybe<Response_&>_> *)in_RCX);
  statusText.content.size_ = (size_t)local_38.content.ptr;
  statusText.content.ptr = (char *)0x1f4;
  sendError(this,(uint)exception,statusText,(String *)local_38.content.size_,
            (Maybe<kj::HttpService::Response_&> *)&local_50);
  String::~String(&local_50);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> handleApplicationError(
      kj::Exception exception, kj::Maybe<kj::HttpService::Response&> response) override {
    return sendError(500, "Internal Server Error",
        kj::str("Saw application error: ", exception.getDescription()), response);
  }